

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_bpf_uninit(ma_bpf *pBPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bpf2 *pmVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if (pBPF != (ma_bpf *)0x0) {
    uVar2 = pBPF->bpf2Count;
    if (uVar2 != 0) {
      lVar4 = 0x38;
      uVar3 = 0;
      do {
        pmVar1 = pBPF->pBPF2;
        if ((pmVar1 != (ma_bpf2 *)0x0) && (*(int *)((long)&(pmVar1->bq).format + lVar4) != 0)) {
          ma_free(*(void **)((long)pmVar1 + lVar4 + -8),pAllocationCallbacks);
          uVar2 = pBPF->bpf2Count;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x40;
      } while (uVar3 < uVar2);
    }
    if (pBPF->_ownsHeap != 0) {
      ma_free(pBPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_bpf_uninit(ma_bpf* pBPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return;
    }

    for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
        ma_bpf2_uninit(&pBPF->pBPF2[ibpf2], pAllocationCallbacks);
    }

    if (pBPF->_ownsHeap) {
        ma_free(pBPF->_pHeap, pAllocationCallbacks);
    }
}